

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O0

void avaluem(double *w,int N,int p,int q,double *phi,double *theta,int tval,double *a)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  double dVar2;
  double *alpha;
  double *w2;
  double *e;
  double temp;
  int iter;
  int newl;
  int t2;
  int t;
  int i;
  int k;
  double *theta_local;
  double *phi_local;
  int q_local;
  int p_local;
  int N_local;
  double *w_local;
  
  __ptr = malloc((long)N << 3);
  __ptr_00 = malloc((long)tval << 3);
  t = q;
  if (q < p) {
    t = p;
  }
  __ptr_01 = malloc((long)(tval + N + t) << 3);
  for (t2 = 0; t2 < N; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr + (long)t2 * 8) = 0;
  }
  for (t2 = 0; t2 < N + tval + t; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr_01 + (long)t2 * 8) = 0;
  }
  for (t2 = 0; t2 < N + tval + -1; t2 = t2 + 1) {
    a[t2] = 0.0;
  }
  for (t2 = 0; t2 < tval; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr_00 + (long)t2 * 8) = 0;
  }
  t2 = N - t;
  while (t2 = t2 + -1, -1 < t2) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      e = (double *)(-phi[newl] * w[t2 + newl + 1] + (double)e);
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      e = (double *)(theta[iter] * *(double *)((long)__ptr + (long)(iter + t2 + 1) * 8) + (double)e)
      ;
    }
    *(double *)((long)__ptr + (long)t2 * 8) = w[t2] + (double)e;
  }
  for (t2 = 0; t2 < tval; t2 = t2 + 1) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      if (newl - t2 < 0) {
        dVar2 = -phi[newl] * *(double *)((long)__ptr_00 + (long)((t2 - newl) + -1) * 8);
      }
      else {
        dVar2 = -phi[newl] * w[newl - t2];
      }
      e = (double *)(dVar2 + (double)e);
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      if (-1 < iter - t2) {
        e = (double *)(theta[iter] * *(double *)((long)__ptr + (long)(iter - t2) * 8) + (double)e);
      }
    }
    *(ulong *)((long)__ptr_00 + (long)t2 * 8) = (ulong)e ^ 0x8000000000000000;
  }
  for (temp._0_4_ = t; iVar1 = t, temp._0_4_ < N + tval + t; temp._0_4_ = temp._0_4_ + 1) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      if ((temp._0_4_ - newl) + -1 < tval + t) {
        if (((temp._0_4_ - newl) + -1 < tval + t) && (t <= (temp._0_4_ - newl) + -1)) {
          e = (double *)
              (-phi[newl] * *(double *)((long)__ptr_00 + (long)((t - temp._0_4_) + tval + newl) * 8)
              + (double)e);
        }
      }
      else {
        e = (double *)(-phi[newl] * w[(((temp._0_4_ - newl) + -1) - tval) - t] + (double)e);
      }
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      if (t <= (temp._0_4_ - iter) + -1) {
        e = (double *)
            (theta[iter] * *(double *)((long)__ptr_01 + (long)((temp._0_4_ - iter) + -1) * 8) +
            (double)e);
      }
    }
    if (temp._0_4_ < tval + t) {
      if (t <= temp._0_4_) {
        *(double *)((long)__ptr_01 + (long)temp._0_4_ * 8) =
             *(double *)((long)__ptr_00 + (long)((t - temp._0_4_) + tval + -1) * 8) + (double)e;
      }
    }
    else {
      *(double *)((long)__ptr_01 + (long)temp._0_4_ * 8) = w[(temp._0_4_ - tval) - t] + (double)e;
    }
  }
  while (temp._0_4_ = iVar1 + 1, temp._0_4_ < N + tval + t) {
    a[(temp._0_4_ - t) + -1] = *(double *)((long)__ptr_01 + (long)temp._0_4_ * 8);
    iVar1 = temp._0_4_;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void avaluem(double *w,int N,int p, int q, double *phi,double *theta,int tval,double *a) {
	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));


	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}
/*
	for(i = 0; i < N;++i) {
		printf("%g \n",e[i]);
	}
*/

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}
/*
	for(i = 0; i < tval;++i) {
		printf("%g \n",w2[i]);
	}
*/


	newl = N + tval;
	

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}
		
		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}

	free(e);
	free(w2);
	free(alpha);
}